

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O1

void cf_sha256_digest_final(cf_sha256_context *ctx,uint8_t *hash)

{
  long lVar1;
  uint uVar2;
  size_t sVar3;
  uint8_t buf [8];
  
  sVar3 = ctx->npartial;
  lVar1 = (ulong)ctx->blocks * 0x200 + sVar3 * 8;
  cf_blockwise_acc_pad
            (ctx->partial,&ctx->npartial,0x40,0x80,'\0','\0',0x40 - (ulong)((int)sVar3 + 8U & 0x3f),
             sha256_update_block,ctx);
  buf[1] = (uint8_t)((ulong)lVar1 >> 0x30);
  buf[0] = (uint8_t)((ulong)lVar1 >> 0x38);
  buf[2] = (uint8_t)((ulong)lVar1 >> 0x28);
  buf[3] = (uint8_t)((ulong)lVar1 >> 0x20);
  buf[4] = (uint8_t)((ulong)lVar1 >> 0x18);
  buf[5] = (uint8_t)((ulong)lVar1 >> 0x10);
  buf[6] = (uint8_t)((ulong)lVar1 >> 8);
  buf[7] = (char)sVar3 * '\b';
  cf_blockwise_accumulate(ctx->partial,&ctx->npartial,0x40,buf,8,sha256_update_block,ctx);
  if (ctx->npartial == 0) {
    uVar2 = ctx->H[0];
    *(uint *)hash = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = ctx->H[1];
    *(uint *)(hash + 4) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = ctx->H[2];
    *(uint *)(hash + 8) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = ctx->H[3];
    *(uint *)(hash + 0xc) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = ctx->H[4];
    *(uint *)(hash + 0x10) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = ctx->H[5];
    *(uint *)(hash + 0x14) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = ctx->H[6];
    *(uint *)(hash + 0x18) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = ctx->H[7];
    *(uint *)(hash + 0x1c) =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    *(undefined8 *)&ctx->blocks = 0;
    ctx->npartial = 0;
    ctx->partial[0x30] = '\0';
    ctx->partial[0x31] = '\0';
    ctx->partial[0x32] = '\0';
    ctx->partial[0x33] = '\0';
    ctx->partial[0x34] = '\0';
    ctx->partial[0x35] = '\0';
    ctx->partial[0x36] = '\0';
    ctx->partial[0x37] = '\0';
    ctx->partial[0x38] = '\0';
    ctx->partial[0x39] = '\0';
    ctx->partial[0x3a] = '\0';
    ctx->partial[0x3b] = '\0';
    ctx->partial[0x3c] = '\0';
    ctx->partial[0x3d] = '\0';
    ctx->partial[0x3e] = '\0';
    ctx->partial[0x3f] = '\0';
    ctx->partial[0x20] = '\0';
    ctx->partial[0x21] = '\0';
    ctx->partial[0x22] = '\0';
    ctx->partial[0x23] = '\0';
    ctx->partial[0x24] = '\0';
    ctx->partial[0x25] = '\0';
    ctx->partial[0x26] = '\0';
    ctx->partial[0x27] = '\0';
    ctx->partial[0x28] = '\0';
    ctx->partial[0x29] = '\0';
    ctx->partial[0x2a] = '\0';
    ctx->partial[0x2b] = '\0';
    ctx->partial[0x2c] = '\0';
    ctx->partial[0x2d] = '\0';
    ctx->partial[0x2e] = '\0';
    ctx->partial[0x2f] = '\0';
    ctx->partial[0x10] = '\0';
    ctx->partial[0x11] = '\0';
    ctx->partial[0x12] = '\0';
    ctx->partial[0x13] = '\0';
    ctx->partial[0x14] = '\0';
    ctx->partial[0x15] = '\0';
    ctx->partial[0x16] = '\0';
    ctx->partial[0x17] = '\0';
    ctx->partial[0x18] = '\0';
    ctx->partial[0x19] = '\0';
    ctx->partial[0x1a] = '\0';
    ctx->partial[0x1b] = '\0';
    ctx->partial[0x1c] = '\0';
    ctx->partial[0x1d] = '\0';
    ctx->partial[0x1e] = '\0';
    ctx->partial[0x1f] = '\0';
    ctx->partial[0] = '\0';
    ctx->partial[1] = '\0';
    ctx->partial[2] = '\0';
    ctx->partial[3] = '\0';
    ctx->partial[4] = '\0';
    ctx->partial[5] = '\0';
    ctx->partial[6] = '\0';
    ctx->partial[7] = '\0';
    ctx->partial[8] = '\0';
    ctx->partial[9] = '\0';
    ctx->partial[10] = '\0';
    ctx->partial[0xb] = '\0';
    ctx->partial[0xc] = '\0';
    ctx->partial[0xd] = '\0';
    ctx->partial[0xe] = '\0';
    ctx->partial[0xf] = '\0';
    ctx->H[4] = 0;
    ctx->H[5] = 0;
    ctx->H[6] = 0;
    ctx->H[7] = 0;
    ctx->H[0] = 0;
    ctx->H[1] = 0;
    ctx->H[2] = 0;
    ctx->H[3] = 0;
    return;
  }
  abort();
}

Assistant:

void cf_sha256_digest_final(cf_sha256_context *ctx, uint8_t hash[CF_SHA256_HASHSZ])
{
  uint64_t digested_bytes = ctx->blocks;
  digested_bytes = digested_bytes * CF_SHA256_BLOCKSZ + ctx->npartial;
  uint64_t digested_bits = digested_bytes * 8;

  size_t padbytes = CF_SHA256_BLOCKSZ - ((digested_bytes + 8) % CF_SHA256_BLOCKSZ);

  /* Hash 0x80 00 ... block first. */
  cf_blockwise_acc_pad(ctx->partial, &ctx->npartial, sizeof ctx->partial,
                       0x80, 0x00, 0x00, padbytes,
                       sha256_update_block, ctx);

  /* Now hash length. */
  uint8_t buf[8];
  write64_be(digested_bits, buf);
  cf_sha256_update(ctx, buf, 8);

  /* We ought to have got our padding calculation right! */
  assert(ctx->npartial == 0);

  write32_be(ctx->H[0], hash + 0);
  write32_be(ctx->H[1], hash + 4);
  write32_be(ctx->H[2], hash + 8);
  write32_be(ctx->H[3], hash + 12);
  write32_be(ctx->H[4], hash + 16);
  write32_be(ctx->H[5], hash + 20);
  write32_be(ctx->H[6], hash + 24);
  write32_be(ctx->H[7], hash + 28);
  
  memset(ctx, 0, sizeof *ctx);
}